

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  ulong uVar1;
  long lVar2;
  scoped_padder p;
  scoped_padder sStack_58;
  format_int local_30;
  
  uVar1 = msg->thread_id | 1;
  lVar2 = 0x3f;
  if (uVar1 != 0) {
    for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  scoped_padder::scoped_padder
            (&sStack_58,
             (ulong)((uint)*(ushort *)
                            (fmt::v7::detail::bsr2log10(int)::data + (uint)((int)lVar2 * 2)) -
                    (uint)(msg->thread_id <
                          *(ulong *)(fmt::v7::detail::basic_data<void>::zero_or_powers_of_10_64_new
                                    + (ulong)*(ushort *)
                                              (fmt::v7::detail::bsr2log10(int)::data +
                                              (uint)((int)lVar2 * 2)) * 8))),
             &(this->super_flag_formatter).padinfo_,dest);
  local_30.str_ = fmt::v7::format_int::format_unsigned<unsigned_long>(&local_30,msg->thread_id);
  lVar2 = (long)&local_30 - (long)local_30.str_;
  if (-0x16 < lVar2) {
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_30.str_,local_30.str_ + lVar2 + 0x15);
    scoped_padder::~scoped_padder(&sStack_58);
    return;
  }
  fmt::v7::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_25/congjiye[P]visiable-webrtc-audio-processing/include/spdlog/fmt/bundled/core.h"
             ,0x146,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }